

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
detail::writer::operator()
          (writer *this,
          flat_map<boost::basic_string_ref<char,_std::char_traits<char>_>,_boost::basic_string_ref<char,_std::char_traits<char>_>,_std::less<boost::basic_string_ref<char,_std::char_traits<char>_>_>,_void>
          *vals)

{
  ushort uVar1;
  stored_size_type sVar2;
  ulong uVar3;
  ulong uVar4;
  size_t __n;
  pointer val;
  pointer ppVar5;
  unsigned_short tmp;
  ushort local_1a;
  
  uVar1 = (ushort)(vals->m_flat_tree).m_data.m_seq.m_holder.m_size;
  local_1a = uVar1 << 8 | uVar1 >> 8;
  uVar3 = (this->buf_).size_;
  if (uVar3 == 0) {
    uVar3 = 0;
  }
  else {
    __n = 2;
    if (uVar3 < 2) {
      __n = uVar3;
    }
    memcpy((this->buf_).data_,&local_1a,__n);
    uVar3 = (this->buf_).size_;
  }
  uVar4 = 2;
  if (uVar3 < 2) {
    uVar4 = uVar3;
  }
  (this->buf_).data_ = (void *)((long)(this->buf_).data_ + uVar4);
  (this->buf_).size_ = uVar3 - uVar4;
  sVar2 = (vals->m_flat_tree).m_data.m_seq.m_holder.m_size;
  if (sVar2 != 0) {
    val = (vals->m_flat_tree).m_data.m_seq.m_holder.m_start;
    ppVar5 = val + sVar2;
    do {
      if (val == (pointer)0x0) {
        __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,
                      "reference boost::container::vec_iterator<std::pair<boost::basic_string_ref<char>, boost::basic_string_ref<char>> *, true>::operator*() const [Pointer = std::pair<boost::basic_string_ref<char>, boost::basic_string_ref<char>> *, IsConst = true]"
                     );
      }
      operator()(this,&val->first);
      operator()(this,&val->second);
      val = val + 1;
    } while (val != ppVar5);
  }
  return;
}

Assistant:

void operator()(boost::container::flat_map<K,V> const& vals) const {
        (*this)(static_cast<uint16_t>(vals.size()));
        for (auto&& val : vals) {
            (*this)(val.first);
            (*this)(val.second);
        }
    }